

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

NFADepartureSet<wchar_t> * __thiscall
Centaurus::NFADepartureSetFactory<wchar_t>::build_departure_set
          (NFADepartureSet<wchar_t> *__return_storage_ptr__,NFADepartureSetFactory<wchar_t> *this)

{
  _Rb_tree_header *__position;
  pointer pNVar1;
  pointer pRVar2;
  pointer pRVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  pointer pRVar7;
  _Base_ptr p_Var8;
  NFATransition<wchar_t> *tr;
  pointer pNVar9;
  NFADepartureSet<wchar_t> *deptset;
  Range<wchar_t> atomic_range;
  IndexVector borders_for_one_tr;
  set<int,_std::less<int>,_std::allocator<int>_> borders;
  Range<wchar_t> local_b0;
  int local_9c;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_98;
  NFADepartureSetFactory<wchar_t> *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  __position = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pNVar9 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  if (pNVar9 != pNVar1) {
    do {
      CharClass<wchar_t>::collect_borders((IndexVector *)&local_98,&pNVar9->m_label);
      p_Var5 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_b0._vptr_Range = (_func_int **)&local_60;
      for (p_Var8 = (_Base_ptr)
                    CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._4_4_,
                             local_98._M_impl.super__Rb_tree_header._M_header._M_color);
          p_Var8 != p_Var5; p_Var8 = (_Base_ptr)&p_Var8->field_0x4) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,(const_iterator)__position,(int *)p_Var8,(_Alloc_node *)&local_b0);
      }
      if ((void *)CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._4_4_,
                           local_98._M_impl.super__Rb_tree_header._M_header._M_color) != (void *)0x0
         ) {
        operator_delete((void *)CONCAT44(local_98._M_impl.super__Rb_tree_header._M_header._4_4_,
                                         local_98._M_impl.super__Rb_tree_header._M_header._M_color))
        ;
      }
      pNVar9 = pNVar9 + 1;
    } while (pNVar9 != pNVar1);
  }
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->_vptr_NFADepartureSet = (_func_int **)&PTR__NFADepartureSet_001c0258;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != __position) {
    p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      if ((_Rb_tree_header *)p_Var6 == __position) break;
      local_b0.m_start = p_Var8[1]._M_color;
      local_b0.m_end = p_Var6[1]._M_color;
      local_b0._vptr_Range = (_func_int **)&PTR__Range_001bf580;
      local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_98._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_98._M_impl.super__Rb_tree_header._M_header;
      local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
      pNVar1 = (local_68->m_transitions).
               super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_98._M_impl.super__Rb_tree_header._M_header._M_right =
           local_98._M_impl.super__Rb_tree_header._M_header._M_left;
      for (pNVar9 = (local_68->m_transitions).
                    super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pNVar9 != pNVar1; pNVar9 = pNVar9 + 1
          ) {
        pRVar2 = (pNVar9->m_label).m_ranges.
                 super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pRVar3 = (pNVar9->m_label).m_ranges.
                 super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar4 = pRVar2 != pRVar3;
        if (pRVar2 == pRVar3) {
LAB_001525ab:
          if (bVar4) goto LAB_001525b0;
        }
        else {
          if ((local_b0.m_start < pRVar2->m_start) || (pRVar2->m_end < local_b0.m_end)) {
            pRVar2 = pRVar2 + 1;
            do {
              pRVar7 = pRVar2;
              bVar4 = pRVar7 != pRVar3;
              if (pRVar7 == pRVar3) break;
              pRVar2 = pRVar7 + 1;
            } while ((local_b0.m_start < pRVar7->m_start) || (pRVar7->m_end < local_b0.m_end));
            goto LAB_001525ab;
          }
LAB_001525b0:
          local_9c = pNVar9->m_dest;
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_insert_unique<int>(&local_98,&local_9c);
        }
      }
      if (local_98._M_impl.super__Rb_tree_header._M_node_count != 0) {
        NFADepartureSet<wchar_t>::add(__return_storage_ptr__,&local_b0,(NFAClosure *)&local_98);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_98);
      p_Var8 = p_Var6;
    } while ((_Rb_tree_header *)p_Var6 != __position);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return __return_storage_ptr__;
}

Assistant:

NFADepartureSet<TCHAR> build_departure_set()
    {
        std::set<int> borders;

        for (const auto& tr : m_transitions)
        {
            IndexVector borders_for_one_tr = tr.label().collect_borders();

            borders.insert(borders_for_one_tr.cbegin(), borders_for_one_tr.cend());
        }

        NFADepartureSet<TCHAR> deptset;

        for (auto i = borders.cbegin(); i != borders.cend();)
        {
            TCHAR atomic_range_start = *i;
            if (++i == borders.cend()) break;
            TCHAR atomic_range_end = *i;

            Range<TCHAR> atomic_range(atomic_range_start, atomic_range_end);

            NFAClosure closure;

            for (const auto& tr : m_transitions)
            {
                if (tr.label().includes(atomic_range))
                {
                    closure.insert(tr.dest());
                }
            }

            if (!closure.empty())
            {
                deptset.add(atomic_range, closure);
            }
        }

        return deptset;
    }